

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::push
          (op_queue<asio::detail::scheduler_operation> *this,scheduler_operation *h)

{
  scheduler_operation *local_18;
  scheduler_operation *h_local;
  op_queue<asio::detail::scheduler_operation> *this_local;
  
  local_18 = h;
  h_local = (scheduler_operation *)this;
  op_queue_access::next<asio::detail::scheduler_operation,asio::detail::scheduler_operation>
            (&local_18,(scheduler_operation *)0x0);
  if (this->back_ == (scheduler_operation *)0x0) {
    this->back_ = local_18;
    this->front_ = local_18;
  }
  else {
    op_queue_access::next<asio::detail::scheduler_operation,asio::detail::scheduler_operation>
              (&this->back_,local_18);
    this->back_ = local_18;
  }
  return;
}

Assistant:

void push(Operation* h)
  {
    op_queue_access::next(h, static_cast<Operation*>(0));
    if (back_)
    {
      op_queue_access::next(back_, h);
      back_ = h;
    }
    else
    {
      front_ = back_ = h;
    }
  }